

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_block(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *this,size_t node,size_t ilevel,size_t do_indent)

{
  Tree *pTVar1;
  NodeType_e NVar2;
  code *pcVar3;
  size_t sVar4;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  bool bVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  error_flags eVar10;
  NodeData *pNVar11;
  NodeScalar *pNVar12;
  csubstr *pcVar13;
  char *a;
  RepC rc;
  RepC rc_00;
  csubstr cVar14;
  char *pcStack_40;
  
  pNVar11 = Tree::_p(this->m_tree,node);
  if ((~(int)(pNVar11->m_type).type & 0x28U) == 0) {
    eVar10 = get_error_flags();
    if (((eVar10 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    pcStack_40 = cVar14.str;
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x597d) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x597d) << 0x40,8);
    loc.name.str = pcStack_40;
    loc.name.len = cVar14.len;
    error("check failed: !m_tree->is_stream(node)",0x26,loc);
  }
  pNVar11 = Tree::_p(this->m_tree,node);
  if ((((pNVar11->m_type).type & (STREAM|MAP)) == NOTYPE) &&
     (pNVar11 = Tree::_p(this->m_tree,node), ((pNVar11->m_type).type & DOC) == NOTYPE)) {
    eVar10 = get_error_flags();
    if (((eVar10 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    pcStack_40 = cVar14.str;
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x597e) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x597e) << 0x40,8);
    loc_00.name.str = pcStack_40;
    loc_00.name.len = cVar14.len;
    error("check failed: m_tree->is_container(node) || m_tree->is_doc(node)",0x40,loc_00);
  }
  bVar6 = Tree::is_root(this->m_tree,node);
  if (!bVar6) {
    pTVar1 = this->m_tree;
    bVar6 = Tree::has_parent(pTVar1,node);
    if (!bVar6) {
      eVar10 = get_error_flags();
      if (((eVar10 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      cVar14 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      pcStack_40 = cVar14.str;
      loc_01.super_LineCol.col = 0;
      loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4beb) << 0x40,0);
      loc_01.super_LineCol.line = SUB168(ZEXT816(0x4beb) << 0x40,8);
      loc_01.name.str = pcStack_40;
      loc_01.name.len = cVar14.len;
      error("check failed: has_parent(node)",0x1e,loc_01);
    }
    pNVar11 = Tree::_p(pTVar1,node);
    pNVar11 = Tree::_p(pTVar1,pNVar11->m_parent);
    if (((pNVar11->m_type).type & MAP) == NOTYPE) {
      pTVar1 = this->m_tree;
      bVar6 = Tree::has_parent(pTVar1,node);
      if (!bVar6) {
        eVar10 = get_error_flags();
        if (((eVar10 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        cVar14 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        pcStack_40 = cVar14.str;
        loc_02.super_LineCol.col = 0;
        loc_02.super_LineCol.offset = SUB168(ZEXT816(0x4bea) << 0x40,0);
        loc_02.super_LineCol.line = SUB168(ZEXT816(0x4bea) << 0x40,8);
        loc_02.name.str = pcStack_40;
        loc_02.name.len = cVar14.len;
        error("check failed: has_parent(node)",0x1e,loc_02);
      }
      pNVar11 = Tree::_p(pTVar1,node);
      pNVar11 = Tree::_p(pTVar1,pNVar11->m_parent);
      if (((pNVar11->m_type).type & SEQ) == NOTYPE) {
        eVar10 = get_error_flags();
        if (((eVar10 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        cVar14 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        pcStack_40 = cVar14.str;
        loc_03.super_LineCol.col = 0;
        loc_03.super_LineCol.offset = SUB168(ZEXT816(0x597f) << 0x40,0);
        loc_03.super_LineCol.line = SUB168(ZEXT816(0x597f) << 0x40,8);
        loc_03.name.str = pcStack_40;
        loc_03.name.len = cVar14.len;
        error("check failed: m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node))"
              ,99,loc_03);
      }
    }
  }
  pNVar11 = Tree::_p(this->m_tree,node);
  if (((pNVar11->m_type).type & DOC) != NOTYPE) {
    _write_doc(this,node);
    bVar6 = Tree::has_children(this->m_tree,node);
    if (!bVar6) {
      return;
    }
    goto LAB_001904dc;
  }
  pNVar11 = Tree::_p(this->m_tree,node);
  if (((pNVar11->m_type).type & (STREAM|MAP)) == NOTYPE) goto LAB_001904dc;
  pNVar11 = Tree::_p(this->m_tree,node);
  if ((((pNVar11->m_type).type & MAP) == NOTYPE) &&
     (pNVar11 = Tree::_p(this->m_tree,node), ((pNVar11->m_type).type & SEQ) == NOTYPE)) {
    eVar10 = get_error_flags();
    if (((eVar10 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    pcStack_40 = cVar14.str;
    loc_04.super_LineCol.col = 0;
    loc_04.super_LineCol.offset = SUB168(ZEXT816(0x598a) << 0x40,0);
    loc_04.super_LineCol.line = SUB168(ZEXT816(0x598a) << 0x40,8);
    loc_04.name.str = pcStack_40;
    loc_04.name.len = cVar14.len;
    error("check failed: m_tree->is_map(node) || m_tree->is_seq(node)",0x3a,loc_04);
  }
  sVar4 = do_indent * ilevel * 2;
  pNVar11 = Tree::_p(this->m_tree,node);
  if (((pNVar11->m_type).type & KEY) == NOTYPE) {
    bVar6 = Tree::is_root(this->m_tree,node);
    if (!bVar6) {
      rc_00.num_times = sVar4;
      rc_00._0_8_ = 0x20;
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,rc_00);
      cVar7 = '-';
      goto LAB_00190369;
    }
    bVar6 = false;
  }
  else {
    rc.num_times = sVar4;
    rc._0_8_ = 0x20;
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,rc);
    pNVar12 = Tree::keysc(this->m_tree,node);
    pNVar11 = Tree::_p(this->m_tree,node);
    _write(this,(int)pNVar12,(void *)(ulong)((uint)(pNVar11->m_type).type & 0x2aa2142),ilevel);
    cVar7 = ':';
LAB_00190369:
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,cVar7);
    bVar6 = true;
  }
  pNVar11 = Tree::_p(this->m_tree,node);
  NVar2 = (pNVar11->m_type).type;
  if ((NVar2 & (SEQ|MAP|VAL)) == NOTYPE || ((uint)NVar2 >> 0xb & 1) == 0) {
    bVar5 = false;
  }
  else {
    if (bVar6) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,' ');
    }
    pcVar13 = Tree::val_tag(this->m_tree,node);
    _write_tag(this,*pcVar13);
    bVar5 = true;
    bVar6 = true;
  }
  pNVar11 = Tree::_p(this->m_tree,node);
  NVar2 = (pNVar11->m_type).type;
  if ((NVar2 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar2 >> 9 & 1) != 0) {
    if (bVar6) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,' ');
    }
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,'&');
    pcVar13 = Tree::val_anchor(this->m_tree,node);
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,*pcVar13);
    bVar5 = true;
    bVar6 = true;
  }
  bVar8 = Tree::has_children(this->m_tree,node);
  pNVar11 = Tree::_p(this->m_tree,node);
  NVar2 = (pNVar11->m_type).type;
  if (!bVar8) {
    if ((NVar2 & SEQ) == NOTYPE) {
      pNVar11 = Tree::_p(this->m_tree,node);
      if (((pNVar11->m_type).type & MAP) == NOTYPE) {
        return;
      }
      a = " {}\n";
    }
    else {
      a = " []\n";
    }
    WriterOStream<std::__cxx11::stringstream>::_do_write<5ul>
              ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [5])a);
    return;
  }
  bVar8 = bVar6;
  if ((NVar2 & KEY) == NOTYPE) {
    bVar9 = Tree::is_root(this->m_tree,node);
    if ((!bVar9) && (bVar8 = true, bVar5)) {
      bVar8 = bVar6;
    }
  }
  else {
    bVar5 = true;
  }
  if (bVar8) {
    if (bVar5) goto LAB_001904c6;
    cVar7 = ' ';
    do_indent = 0;
  }
  else {
    if (!bVar5) {
      do_indent = 0;
      goto LAB_001904dc;
    }
LAB_001904c6:
    do_indent = 1;
    cVar7 = '\n';
  }
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_do_write(&this->
               super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ,cVar7);
LAB_001904dc:
  bVar6 = Tree::is_root(this->m_tree,node);
  if ((!bVar6) && (pNVar11 = Tree::_p(this->m_tree,node), ((pNVar11->m_type).type & DOC) == NOTYPE))
  {
    ilevel = ilevel + 1;
  }
  _do_visit_block_container(this,node,ilevel,do_indent);
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_block(size_t node, size_t ilevel, size_t do_indent)
{
    RYML_ASSERT(!m_tree->is_stream(node));
    RYML_ASSERT(m_tree->is_container(node) || m_tree->is_doc(node));
    RYML_ASSERT(m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node)));
    RepC ind = indent_to(do_indent * ilevel);

    if(m_tree->is_doc(node))
    {
        _write_doc(node);
        if(!m_tree->has_children(node))
            return;
    }
    else if(m_tree->is_container(node))
    {
        RYML_ASSERT(m_tree->is_map(node) || m_tree->is_seq(node));

        bool spc = false; // write a space
        bool nl = false;  // write a newline

        if(m_tree->has_key(node))
        {
            this->Writer::_do_write(ind);
            _writek(node, ilevel);
            this->Writer::_do_write(':');
            spc = true;
        }
        else if(!m_tree->is_root(node))
        {
            this->Writer::_do_write(ind);
            this->Writer::_do_write('-');
            spc = true;
        }

        if(m_tree->has_val_tag(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(node));
            spc = true;
            nl = true;
        }

        if(m_tree->has_val_anchor(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(node));
            spc = true;
            nl = true;
        }

        if(m_tree->has_children(node))
        {
            if(m_tree->has_key(node))
                nl = true;
            else
                if(!m_tree->is_root(node) && !nl)
                    spc = true;
        }
        else
        {
            if(m_tree->is_seq(node))
                this->Writer::_do_write(" []\n");
            else if(m_tree->is_map(node))
                this->Writer::_do_write(" {}\n");
            return;
        }

        if(spc && !nl)
            this->Writer::_do_write(' ');

        do_indent = 0;
        if(nl)
        {
            this->Writer::_do_write('\n');
            do_indent = 1;
        }
    } // container

    size_t next_level = ilevel + 1;
    if(m_tree->is_root(node) || m_tree->is_doc(node))
        next_level = ilevel; // do not indent at top level

    _do_visit_block_container(node, next_level, do_indent);
}